

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_inkey(ui_event *ch,_Bool wait,_Bool take)

{
  undefined3 uVar1;
  uint16_t uVar2;
  ui_event *puVar3;
  ui_event e;
  _Bool take_local;
  _Bool wait_local;
  ui_event *ch_local;
  
  memset(ch,0,0xc);
  if ((Term->never_bored & 1U) == 0) {
    Term_xtra(L'\t',L'\0');
  }
  if (wait) {
    while (Term->key_head == Term->key_tail) {
      Term_xtra(L'\x01',L'\x01');
    }
  }
  else if (Term->key_head == Term->key_tail) {
    Term_xtra(L'\x01',L'\0');
  }
  if (Term->key_head == Term->key_tail) {
    ch_local._4_4_ = 1;
  }
  else {
    puVar3 = Term->key_queue + Term->key_tail;
    ch->mouse = puVar3->mouse;
    uVar1 = *(undefined3 *)((long)puVar3 + 9);
    *(uint8_t *)((long)ch + 8) = *(uint8_t *)((long)puVar3 + 8);
    *(undefined3 *)((long)ch + 9) = uVar1;
    e._9_3_ = 0;
    e._0_9_ = *(unkuint9 *)ch;
    log_keypress(e);
    if ((take) && (uVar2 = Term->key_tail + 1, Term->key_tail = uVar2, uVar2 == Term->key_size)) {
      Term->key_tail = 0;
    }
    ch_local._4_4_ = 0;
  }
  return ch_local._4_4_;
}

Assistant:

errr Term_inkey(ui_event *ch, bool wait, bool take)
{
	/* Assume no key */
	memset(ch, 0, sizeof *ch);

	/* Hack -- get bored */
	if (!Term->never_bored)
		/* Process random events */
		Term_xtra(TERM_XTRA_BORED, 0);

	/* Wait or not */
	if (wait)
		/* Process pending events while necessary */
		while (Term->key_head == Term->key_tail)
			/* Process events (wait for one) */
			Term_xtra(TERM_XTRA_EVENT, true);
	else
		/* Process pending events if necessary */
		if (Term->key_head == Term->key_tail)
			/* Process events (do not wait) */
			Term_xtra(TERM_XTRA_EVENT, false);

	/* No keys are ready */
	if (Term->key_head == Term->key_tail) return (1);

	/* Extract the next keypress */
	(*ch) = Term->key_queue[Term->key_tail];

	/* sketchy key loggin */
	log_keypress(*ch);

	/* If requested, advance the queue, wrap around if necessary */
	if (take && (++Term->key_tail == Term->key_size)) Term->key_tail = 0;

	/* Success */
	return (0);
}